

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImDrawDataBuilder::Clear(ImDrawDataBuilder *this)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 0x10) {
    ImVector<ImDrawList_*>::resize
              ((ImVector<ImDrawList_*> *)((long)&this->Layers[0].Size + lVar1),0);
  }
  return;
}

Assistant:

void Clear()            { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].resize(0); }